

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O1

void soul::ResolutionPass::FunctionResolver::findLeastMisspeltFunction
               (Scope *scope,string *name,string *nearest,size_t *lowestDistance)

{
  long *plVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t sVar4;
  undefined4 extraout_var_00;
  long *extraout_RDX;
  long *extraout_RDX_00;
  pool_ref<soul::AST::ModuleBase> *sub;
  string functionName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  long *local_d0;
  string local_c8;
  IdentifierPath local_a8;
  string local_50;
  long *plVar3;
  
  iVar2 = (*scope->_vptr_Scope[0xd])();
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  if (plVar3 != extraout_RDX) {
    local_d0 = extraout_RDX;
    do {
      plVar1 = *(long **)(*plVar3 + 0x38);
      if (plVar1 == (long *)0x0) {
        throwInternalCompilerError("isValid()","toString",0x23);
      }
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_f0,*plVar1,plVar1[1] + *plVar1);
      sVar4 = choc::text::getLevenshteinDistance<std::__cxx11::string>(name,&local_f0);
      if (sVar4 < *lowestDistance) {
        *lowestDistance = sVar4;
        (*scope->_vptr_Scope[2])(&local_a8);
        IdentifierPath::toString_abi_cxx11_(&local_c8,&local_a8);
        TokenisedPathString::join(&local_50,&local_c8,&local_f0);
        std::__cxx11::string::operator=((string *)nearest,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        local_a8.pathSections.numActive = 0;
        if (8 < local_a8.pathSections.numAllocated) {
          if (local_a8.pathSections.items != (Identifier *)0x0) {
            operator_delete__(local_a8.pathSections.items);
          }
          local_a8.pathSections.items = (Identifier *)local_a8.pathSections.space;
          local_a8.pathSections.numAllocated = 8;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      plVar3 = plVar3 + 1;
    } while (plVar3 != local_d0);
  }
  iVar2 = (*scope->_vptr_Scope[0x11])();
  for (plVar3 = (long *)CONCAT44(extraout_var_00,iVar2); plVar3 != extraout_RDX_00;
      plVar3 = plVar3 + 1) {
    findLeastMisspeltFunction((Scope *)(*plVar3 + 0x28),name,nearest,lowestDistance);
  }
  return;
}

Assistant:

static void findLeastMisspeltFunction (AST::Scope& scope, const std::string& name, std::string& nearest, size_t& lowestDistance)
        {
            for (auto& f : scope.getFunctions())
            {
                auto functionName = f->name.toString();
                auto distance = choc::text::getLevenshteinDistance (name, functionName);

                if (distance < lowestDistance)
                {
                    lowestDistance = distance;
                    nearest = TokenisedPathString::join (scope.getFullyQualifiedPath().toString(), functionName);
                }
            }

            for (auto& sub : scope.getSubModules())
                findLeastMisspeltFunction (sub, name, nearest, lowestDistance);
        }